

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

void __thiscall
absl::anon_unknown_0::AppendNumberUnit(anon_unknown_0 *this,string *out,int64_t n,DisplayUnit unit)

{
  size_type *psVar1;
  char cVar2;
  char *in_RCX;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  char *__s;
  char acStack_39 [17];
  
  uVar5 = 0xffffffff;
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    cVar2 = (char)out + (char)(string *)((long)out / 10) * -10 + '0';
    acStack_39[uVar3 + 1] = cVar2;
    psVar1 = &out->_M_string_length;
    uVar4 = uVar3 - 1;
    uVar5 = uVar5 - 1;
    out = (string *)((long)out / 10);
  } while ((undefined1 *)0x12 < (undefined1 *)((long)psVar1 + 1));
  if ((int)uVar4 + 1 < 2) {
    __s = acStack_39 + uVar3 + 1;
  }
  else {
    __s = acStack_39 + (uVar4 - uVar5) + 1;
    memset(__s,0x30,uVar4 & 0xffffffff);
    cVar2 = *__s;
  }
  if ((cVar2 != '0') || (__s + 1 != acStack_39 + 2)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,__s,
               (long)(acStack_39 + 2) - (long)__s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,in_RCX,n);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, int64_t n, DisplayUnit unit) {
  char buf[sizeof("2562047788015216")];  // hours in max duration
  char* const ep = buf + sizeof(buf);
  char* bp = Format64(ep, 0, n);
  if (*bp != '0' || bp + 1 != ep) {
    out->append(bp, ep - bp);
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}